

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsLinuxELFLinker.cxx
# Opt level: O1

bool __thiscall
cmBinUtilsLinuxELFLinker::ResolveDependency
          (cmBinUtilsLinuxELFLinker *this,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *searchPaths,string *path,bool *resolved)

{
  pointer pbVar1;
  bool bVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  ostream *poVar4;
  cmMakefile *this_00;
  pointer pbVar5;
  bool bVar6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  ostringstream warning;
  string local_200;
  string local_1c8;
  undefined1 local_1a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  undefined8 local_190;
  undefined1 *local_188;
  undefined8 local_180;
  size_type local_178;
  pointer local_170;
  undefined8 local_168;
  ios_base local_138 [264];
  
  pbVar5 = (searchPaths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (searchPaths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = pbVar5 == pbVar1;
  if (!bVar6) {
    do {
      local_1a8._8_8_ = (pbVar5->_M_dataplus)._M_p;
      local_1a8._0_8_ = pbVar5->_M_string_length;
      local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_200._M_dataplus._M_p = (pointer)0x0;
      local_200._M_string_length = 1;
      local_200.field_2._M_allocated_capacity = (long)&local_200.field_2 + 8;
      local_200.field_2._M_local_buf[8] = '/';
      local_190 = 1;
      local_180 = 0;
      local_170 = (name->_M_dataplus)._M_p;
      local_178 = name->_M_string_length;
      local_168 = 0;
      views._M_len = 3;
      views._M_array = (iterator)local_1a8;
      local_188 = (undefined1 *)local_200.field_2._M_allocated_capacity;
      cmCatViews(&local_1c8,views);
      std::__cxx11::string::operator=((string *)path,(string *)&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      bVar2 = cmsys::SystemTools::PathExists(path);
      if ((bVar2) &&
         (bVar2 = anon_unknown.dwarf_26f449d::FileHasArchitecture
                            ((path->_M_dataplus)._M_p,this->Machine), bVar2)) {
        *resolved = true;
        if (!bVar6) {
          return true;
        }
        break;
      }
      pbVar5 = pbVar5 + 1;
      bVar6 = pbVar5 == pbVar1;
    } while (!bVar6);
  }
  pvVar3 = cmRuntimeDependencyArchive::GetSearchDirectories_abi_cxx11_
                     ((this->super_cmBinUtilsLinker).Archive);
  pbVar5 = (pvVar3->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (pvVar3->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = pbVar5 == pbVar1;
  if (!bVar6) {
    do {
      local_1a8._8_8_ = (pbVar5->_M_dataplus)._M_p;
      local_1a8._0_8_ = pbVar5->_M_string_length;
      local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_200._M_dataplus._M_p = (pointer)0x0;
      local_200._M_string_length = 1;
      local_200.field_2._M_allocated_capacity = (long)&local_200.field_2 + 8;
      local_200.field_2._M_local_buf[8] = '/';
      local_190 = 1;
      local_180 = 0;
      local_170 = (name->_M_dataplus)._M_p;
      local_178 = name->_M_string_length;
      local_168 = 0;
      views_00._M_len = 3;
      views_00._M_array = (iterator)local_1a8;
      local_188 = (undefined1 *)local_200.field_2._M_allocated_capacity;
      cmCatViews(&local_1c8,views_00);
      std::__cxx11::string::operator=((string *)path,(string *)&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      bVar2 = cmsys::SystemTools::PathExists(path);
      if ((bVar2) &&
         (bVar2 = anon_unknown.dwarf_26f449d::FileHasArchitecture
                            ((path->_M_dataplus)._M_p,this->Machine), bVar2)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Dependency ",0xb);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4," found in search directory:\n  ",0x1e);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"\nSee file(GET_RUNTIME_DEPENDENCIES) documentation for ",0x36);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"more information.",0x11);
        this_00 = cmRuntimeDependencyArchive::GetMakefile((this->super_cmBinUtilsLinker).Archive);
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(this_00,WARNING,&local_200);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,
                          (ulong)(local_200.field_2._M_allocated_capacity + 1));
        }
        *resolved = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        if (!bVar6) {
          return true;
        }
        break;
      }
      pbVar5 = pbVar5 + 1;
      bVar6 = pbVar5 == pbVar1;
    } while (!bVar6);
  }
  *resolved = false;
  return true;
}

Assistant:

bool cmBinUtilsLinuxELFLinker::ResolveDependency(
  std::string const& name, std::vector<std::string> const& searchPaths,
  std::string& path, bool& resolved)
{
  for (auto const& searchPath : searchPaths) {
    path = cmStrCat(searchPath, '/', name);
    if (cmSystemTools::PathExists(path) &&
        FileHasArchitecture(path.c_str(), this->Machine)) {
      resolved = true;
      return true;
    }
  }

  for (auto const& searchPath : this->Archive->GetSearchDirectories()) {
    path = cmStrCat(searchPath, '/', name);
    if (cmSystemTools::PathExists(path) &&
        FileHasArchitecture(path.c_str(), this->Machine)) {
      std::ostringstream warning;
      warning << "Dependency " << name << " found in search directory:\n  "
              << searchPath
              << "\nSee file(GET_RUNTIME_DEPENDENCIES) documentation for "
              << "more information.";
      this->Archive->GetMakefile()->IssueMessage(MessageType::WARNING,
                                                 warning.str());
      resolved = true;
      return true;
    }
  }

  resolved = false;
  return true;
}